

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<int,_8UL>::small_vector
          (small_vector<int,_8UL> *this,initializer_list<int> init)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  value_type_conflict2 *__value;
  long lVar3;
  back_insert_iterator<pstore::small_vector<int,_8UL>_> local_30;
  
  __n = init._M_len;
  __value = init._M_array;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->small_buffer_)._M_elems[6] = 0;
  (this->small_buffer_)._M_elems[7] = 0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->small_buffer_)._M_elems[2] = 0;
  (this->small_buffer_)._M_elems[3] = 0;
  (this->small_buffer_)._M_elems[4] = 0;
  (this->small_buffer_)._M_elems[5] = 0;
  this->elements_ = 0;
  (this->small_buffer_)._M_elems[0] = 0;
  (this->small_buffer_)._M_elems[1] = 0;
  this->buffer_ = (this->small_buffer_)._M_elems;
  uVar1 = (long)(this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage -
          (long)(this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar2 = 8;
  if (8 < uVar1) {
    uVar2 = uVar1;
  }
  if (uVar2 < __n) {
    std::vector<int,_std::allocator<int>_>::reserve(&this->big_buffer_,__n);
  }
  if (0 < (long)__n) {
    lVar3 = __n + 1;
    local_30.container = this;
    do {
      std::back_insert_iterator<pstore::small_vector<int,_8UL>_>::operator=(&local_30,__value);
      __value = __value + 1;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::initializer_list<ElementType> init)
            : small_vector () {
        this->reserve (init.size ());
        std::copy (std::begin (init), std::end (init), std::back_inserter (*this));
    }